

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2c-test.cpp
# Opt level: O0

void __thiscall CommandOptions::CommandOptions(CommandOptions *this,int argc,char **argv)

{
  char *__s;
  bool bVar1;
  int iVar2;
  allocator<char> local_49;
  value_type local_48;
  int local_24;
  char **ppcStack_20;
  int i;
  char **argv_local;
  CommandOptions *pCStack_10;
  int argc_local;
  CommandOptions *this_local;
  
  this->error_flag = true;
  this->version_flag = false;
  this->verbose_flag = false;
  this->detail_flag = false;
  this->help_flag = false;
  ppcStack_20 = argv;
  argv_local._4_4_ = argc;
  pCStack_10 = this;
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::list(&this->filename_list);
  for (local_24 = 1; local_24 < argv_local._4_4_; local_24 = local_24 + 1) {
    if (((*ppcStack_20[local_24] == '-') &&
        (iVar2 = isalpha((int)ppcStack_20[local_24][1]), iVar2 != 0)) &&
       (ppcStack_20[local_24][2] == '\0')) {
      switch(ppcStack_20[local_24][1]) {
      case 'V':
        this->version_flag = true;
        break;
      default:
        fprintf(_stderr,"Unrecognized option: %c\n",(ulong)(uint)(int)ppcStack_20[local_24][1]);
        return;
      case 'h':
        this->help_flag = true;
        break;
      case 'r':
        this->detail_flag = true;
        break;
      case 'v':
        this->verbose_flag = true;
      }
    }
    else {
      __s = ppcStack_20[local_24];
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,__s,&local_49);
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->filename_list,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::allocator<char>::~allocator(&local_49);
    }
  }
  bVar1 = std::__cxx11::
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->filename_list);
  if (bVar1) {
    fputs("Input j2c filename(s) required.\n",_stderr);
  }
  else {
    this->error_flag = false;
  }
  return;
}

Assistant:

CommandOptions(int argc, const char** argv) :
    error_flag(true), version_flag(false), verbose_flag(false),
    detail_flag(false), help_flag(false)
  {
    for ( int i = 1; i < argc; i++ )
      {
	if ( argv[i][0] == '-' && isalpha(argv[i][1]) && argv[i][2] == 0 )
	  {
	    switch ( argv[i][1] )
	      {
	      case 'V': version_flag = true; break;
	      case 'h': help_flag = true; break;
	      case 'r': detail_flag = true; break;
	      case 'v': verbose_flag = true; break;

	      default:
		fprintf(stderr, "Unrecognized option: %c\n", argv[i][1]);
		return;
	      }
	  }
	else
	  {
	    filename_list.push_back(argv[i]);
	  }
      }

    if ( filename_list.empty() )
      {
	fputs("Input j2c filename(s) required.\n", stderr);
	return;
      }

    error_flag = false;
  }